

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O0

HTreeGroup * VP8LHtreeGroupsNew(int num_htree_groups)

{
  HTreeGroup *pHVar1;
  undefined4 in_EDI;
  HTreeGroup *htree_groups;
  undefined4 in_stack_fffffffffffffff0;
  uint64_t in_stack_fffffffffffffff8;
  
  pHVar1 = (HTreeGroup *)
           WebPSafeMalloc(in_stack_fffffffffffffff8,CONCAT44(in_EDI,in_stack_fffffffffffffff0));
  if (pHVar1 == (HTreeGroup *)0x0) {
    pHVar1 = (HTreeGroup *)0x0;
  }
  return pHVar1;
}

Assistant:

HTreeGroup* VP8LHtreeGroupsNew(int num_htree_groups) {
  HTreeGroup* const htree_groups =
      (HTreeGroup*)WebPSafeMalloc(num_htree_groups, sizeof(*htree_groups));
  if (htree_groups == NULL) {
    return NULL;
  }
  assert(num_htree_groups <= MAX_HTREE_GROUPS);
  return htree_groups;
}